

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MruDictionary.h
# Opt level: O0

void __thiscall
JsUtil::
MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
::RemoveRecentlyUnusedItems
          (MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
           *this)

{
  int iVar1;
  MruListEntry *local_20;
  MruListEntry *entry;
  MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
  *this_local;
  
  iVar1 = BaseDictionary<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::Count(&this->dictionary);
  if (iVar1 != this->mruListCount) {
    iVar1 = BaseDictionary<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::Count(&this->dictionary);
    if (this->mruListCount < iVar1 / 2) {
      BaseDictionary<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Clear(&this->dictionary);
      for (local_20 = DoublyLinkedList<JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruListEntry,_Memory::Recycler>
                      ::Head(&this->entries); local_20 != (MruListEntry *)0x0;
          local_20 = DoublyLinkedListElement<JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruListEntry,_Memory::Recycler>
                     ::Next(&local_20->
                             super_DoublyLinkedListElement<JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruListEntry,_Memory::Recycler>
                           )) {
        AddToDictionary(this,local_20);
      }
    }
    else {
      BaseDictionary<UnifiedRegex::RegexKey,JsUtil::MruDictionary<UnifiedRegex::RegexKey,UnifiedRegex::RegexPattern*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry>::MruDictionaryData,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      MapAndRemoveIf<JsUtil::MruDictionary<UnifiedRegex::RegexKey,UnifiedRegex::RegexPattern*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry>::RemoveRecentlyUnusedItems()::_lambda(JsUtil::SimpleDictionaryEntry<UnifiedRegex::RegexKey,JsUtil::MruDictionary<UnifiedRegex::RegexKey,UnifiedRegex::RegexPattern*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry>::MruDictionaryData>const&)_1_>
                ((BaseDictionary<UnifiedRegex::RegexKey,JsUtil::MruDictionary<UnifiedRegex::RegexKey,UnifiedRegex::RegexPattern*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry>::MruDictionaryData,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)&this->dictionary,2,(long)iVar1 % 2 & 0xffffffff);
    }
  }
  return;
}

Assistant:

void RemoveRecentlyUnusedItems()
        {
            if(dictionary.Count() == mruListCount)
                return;

            if(dictionary.Count() / 2 <= mruListCount)
            {
                dictionary.MapAndRemoveIf(
                    [](const typename TDictionary::EntryType &dictionaryEntry) -> bool
                    {
                        return !dictionaryEntry.Value().Entry();
                    });
                return;
            }

            dictionary.Clear();
            for(auto entry = entries.Head(); entry; entry = entry->Next())
                AddToDictionary(entry);
        }